

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

QGraphicsItem * __thiscall
QGraphicsScene::itemAt(QGraphicsScene *this,QPointF *position,QTransform *deviceTransform)

{
  long lVar1;
  bool bVar2;
  QGraphicsItem **ppQVar3;
  QTransform *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QList<QGraphicsItem_*> itemsAtPoint;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffffc0;
  QGraphicsItem *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  items((QGraphicsScene *)&DAT_aaaaaaaaaaaaaaaa,(QPointF *)&DAT_aaaaaaaaaaaaaaaa,
        (ItemSelectionMode)((ulong)in_RDI >> 0x20),(SortOrder)in_RDI,in_RSI);
  bVar2 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9cac65);
  if (bVar2) {
    pQVar4 = (QGraphicsItem *)0x0;
  }
  else {
    ppQVar3 = QList<QGraphicsItem_*>::first(in_stack_ffffffffffffffc0);
    pQVar4 = *ppQVar3;
  }
  QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0x9cac99);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItem *QGraphicsScene::itemAt(const QPointF &position, const QTransform &deviceTransform) const
{
    const QList<QGraphicsItem *> itemsAtPoint = items(position, Qt::IntersectsItemShape,
                                                      Qt::DescendingOrder, deviceTransform);
    return itemsAtPoint.isEmpty() ? nullptr : itemsAtPoint.first();
}